

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O1

DEV_DEF ** SndEmu_GetDevDefList(UINT8 deviceID)

{
  undefined3 in_register_00000039;
  
  switch(CONCAT31(in_register_00000039,deviceID)) {
  case 0:
    return devDefList_SN76496;
  case 1:
    return devDefList_YM2413;
  case 2:
    return devDefList_YM2612;
  case 3:
    return devDefList_YM2151;
  case 4:
    return devDefList_SegaPCM;
  case 5:
    return devDefList_RF5C68;
  case 6:
    return devDefList_YM2203;
  case 7:
    return devDefList_YM2608;
  case 8:
    return devDefList_YM2610;
  case 9:
    return devDefList_YM3812;
  case 10:
    return devDefList_YM3526;
  case 0xb:
    return devDefList_Y8950;
  case 0xc:
    return devDefList_YMF262;
  case 0xd:
    return devDefList_YMF278B;
  case 0xe:
    return devDefList_YMF271;
  case 0xf:
    return devDefList_YMZ280B;
  case 0x10:
    goto switchD_00122655_caseD_10;
  case 0x11:
    return devDefList_32X_PWM;
  case 0x12:
    return devDefList_AY8910;
  case 0x13:
    return devDefList_GB_DMG;
  case 0x14:
    return devDefList_NES_APU;
  case 0x15:
    return devDefList_YMW258;
  case 0x16:
    return devDefList_uPD7759;
  case 0x17:
    return devDefList_OKIM6258;
  case 0x18:
    return devDefList_OKIM6295;
  case 0x19:
    return devDefList_K051649;
  case 0x1a:
    return devDefList_K054539;
  case 0x1b:
    return devDefList_C6280;
  case 0x1c:
    return devDefList_C140;
  case 0x1d:
    return devDefList_K053260;
  case 0x1e:
    return devDefList_Pokey;
  case 0x1f:
    return devDefList_QSound;
  case 0x20:
    return devDefList_SCSP;
  case 0x21:
    return devDefList_WSwan;
  case 0x22:
    return devDefList_VBoyVSU;
  case 0x23:
    return devDefList_SAA1099;
  case 0x24:
    return devDefList_ES5503;
  case 0x25:
    return devDefList_ES5506;
  case 0x26:
    return devDefList_X1_010;
  case 0x27:
    return devDefList_C352;
  case 0x28:
    return devDefList_GA20;
  case 0x29:
    return devDefList_Mikey;
  default:
    if (CONCAT31(in_register_00000039,deviceID) == 0x80) {
      return devDefList_C219;
    }
switchD_00122655_caseD_10:
    return (DEV_DEF **)0x0;
  }
}

Assistant:

const DEV_DEF** SndEmu_GetDevDefList(UINT8 deviceID)
{
	switch(deviceID)
	{
#ifdef SNDDEV_SN76496
	case DEVID_SN76496:
		return devDefList_SN76496;
#endif
#ifdef SNDDEV_YM2413
	case DEVID_YM2413:
		return devDefList_YM2413;
#endif
#ifdef SNDDEV_YM2612
	case DEVID_YM2612:
		return devDefList_YM2612;
#endif
#ifdef SNDDEV_YM2151
	case DEVID_YM2151:
		return devDefList_YM2151;
#endif
#ifdef SNDDEV_SEGAPCM
	case DEVID_SEGAPCM:
		return devDefList_SegaPCM;
#endif
#ifdef SNDDEV_RF5C68
	case DEVID_RF5C68:
		return devDefList_RF5C68;
#endif
#ifdef SNDDEV_YM2203
	case DEVID_YM2203:
		return devDefList_YM2203;
#endif
#ifdef SNDDEV_YM2608
	case DEVID_YM2608:
		return devDefList_YM2608;
#endif
#ifdef SNDDEV_YM2610
	case DEVID_YM2610:
		return devDefList_YM2610;
#endif
#ifdef SNDDEV_YM3812
	case DEVID_YM3812:
		return devDefList_YM3812;
#endif
#ifdef SNDDEV_YM3526
	case DEVID_YM3526:
		return devDefList_YM3526;
#endif
#ifdef SNDDEV_Y8950
	case DEVID_Y8950:
		return devDefList_Y8950;
#endif
#ifdef SNDDEV_YMF262
	case DEVID_YMF262:
		return devDefList_YMF262;
#endif
#ifdef SNDDEV_YMF278B
	case DEVID_YMF278B:
		return devDefList_YMF278B;
#endif
#ifdef SNDDEV_YMF271
	case DEVID_YMF271:
		return devDefList_YMF271;
#endif
#ifdef SNDDEV_YMZ280B
	case DEVID_YMZ280B:
		return devDefList_YMZ280B;
#endif
#ifdef SNDDEV_32X_PWM
	case DEVID_32X_PWM:
		return devDefList_32X_PWM;
#endif
#ifdef SNDDEV_AY8910
	case DEVID_AY8910:
		return devDefList_AY8910;
#endif
#ifdef SNDDEV_GAMEBOY
	case DEVID_GB_DMG:
		return devDefList_GB_DMG;
#endif
#ifdef SNDDEV_NES_APU
	case DEVID_NES_APU:
		return devDefList_NES_APU;
#endif
#ifdef SNDDEV_YMW258
	case DEVID_YMW258:
		return devDefList_YMW258;
#endif
#ifdef SNDDEV_UPD7759
	case DEVID_uPD7759:
		return devDefList_uPD7759;
#endif
#ifdef SNDDEV_OKIM6258
	case DEVID_OKIM6258:
		return devDefList_OKIM6258;
#endif
#ifdef SNDDEV_OKIM6295
	case DEVID_OKIM6295:
		return devDefList_OKIM6295;
#endif
#ifdef SNDDEV_K051649
	case DEVID_K051649:
		return devDefList_K051649;
#endif
#ifdef SNDDEV_K054539
	case DEVID_K054539:
		return devDefList_K054539;
#endif
#ifdef SNDDEV_C6280
	case DEVID_C6280:
		return devDefList_C6280;
#endif
#ifdef SNDDEV_C140
	case DEVID_C140:
		return devDefList_C140;
#endif
#ifdef SNDDEV_C219
	case DEVID_C219:
		return devDefList_C219;
#endif
#ifdef SNDDEV_K053260
	case DEVID_K053260:
		return devDefList_K053260;
#endif
#ifdef SNDDEV_POKEY
	case DEVID_POKEY:
		return devDefList_Pokey;
#endif
#ifdef SNDDEV_QSOUND
	case DEVID_QSOUND:
		return devDefList_QSound;
#endif
#ifdef SNDDEV_SCSP
	case DEVID_SCSP:
		return devDefList_SCSP;
#endif
#ifdef SNDDEV_WSWAN
	case DEVID_WSWAN:
		return devDefList_WSwan;
#endif
#ifdef SNDDEV_VBOY_VSU
	case DEVID_VBOY_VSU:
		return devDefList_VBoyVSU;
#endif
#ifdef SNDDEV_SAA1099
	case DEVID_SAA1099:
		return devDefList_SAA1099;
#endif
#ifdef SNDDEV_ES5503
	case DEVID_ES5503:
		return devDefList_ES5503;
#endif
#ifdef SNDDEV_ES5506
	case DEVID_ES5506:
		return devDefList_ES5506;
#endif
#ifdef SNDDEV_X1_010
	case DEVID_X1_010:
		return devDefList_X1_010;
#endif
#ifdef SNDDEV_C352
	case DEVID_C352:
		return devDefList_C352;
#endif
#ifdef SNDDEV_GA20
	case DEVID_GA20:
		return devDefList_GA20;
#endif
#ifdef SNDDEV_MIKEY
	case DEVID_MIKEY:
		return devDefList_Mikey;
#endif
	default:
		return NULL;
	}
}